

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StreamReader.h
# Opt level: O3

void __thiscall
Assimp::StreamReader<false,_false>::StreamReader
          (StreamReader<false,_false> *this,IOStream *stream,bool le)

{
  (this->stream).super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr = stream;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Assimp::IOStream*>
            (&(this->stream).super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,stream);
  this->le = le;
  if (stream != (IOStream *)0x0) {
    InternBegin(this);
    return;
  }
  __assert_fail("stream",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/include/assimp/StreamReader.h"
                ,0x67,
                "Assimp::StreamReader<>::StreamReader(IOStream *, bool) [SwapEndianess = false, RuntimeSwitch = false]"
               );
}

Assistant:

StreamReader(IOStream* stream, bool le = false)
        : stream(std::shared_ptr<IOStream>(stream))
        , le(le)
    {
        ai_assert(stream);
        InternBegin();
    }